

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

xmlMutexPtr xmlNewMutex(void)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)malloc(0x28);
  if ((__mutex != (pthread_mutex_t *)0x0) && (libxml_is_threaded != 0)) {
    pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  }
  return (xmlMutexPtr)__mutex;
}

Assistant:

xmlMutexPtr
xmlNewMutex(void)
{
    xmlMutexPtr tok;

    if ((tok = malloc(sizeof(xmlMutex))) == NULL)
        return (NULL);
#ifdef HAVE_POSIX_THREADS
    if (libxml_is_threaded != 0)
        pthread_mutex_init(&tok->lock, NULL);
#elif defined HAVE_WIN32_THREADS
    InitializeCriticalSection(&tok->cs);
#endif
    return (tok);
}